

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O2

bool ReadFile(string *path,MemoryBus *memory,uint16_t start)

{
  uint *puVar1;
  char cVar2;
  istream *piVar3;
  ushort uVar4;
  uint8_t data;
  ifstream file;
  uint auStack_220 [124];
  
  std::ifstream::ifstream(&file,(string *)path,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    puVar1 = (uint *)((long)auStack_220 + *(long *)(_file + -0x18));
    *puVar1 = *puVar1 & 0xffffefff;
    uVar4 = start - 1;
    if (start == 0) {
      uVar4 = 0;
    }
    while( true ) {
      uVar4 = uVar4 + 1;
      piVar3 = std::operator>>((istream *)&file,(char *)&data);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      (*memory->_vptr_MemoryBus[3])(memory,(ulong)uVar4,(ulong)data);
    }
  }
  std::ifstream::~ifstream(&file);
  return (bool)cVar2;
}

Assistant:

inline bool ReadFile(const std::string& path, MemoryBus& memory, uint16_t start = 0)
{
    std::ifstream file(path, std::ios::binary);

    if(file.is_open())
    {
        file >> std::noskipws;
        
        uint8_t data;
        uint16_t index = start > 0 ? start - 1 : 0;
        
        while(file >> data)
            memory.Write(++index, data);
        
        return true;
    }
    
    return false;
}